

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O0

void __thiscall flow::MatchInstr::MatchInstr(MatchInstr *this,MatchClass op,Value *cond)

{
  initializer_list<flow::Value_*> __l;
  allocator<flow::Value_*> local_59;
  Value *local_58;
  undefined8 local_50;
  iterator local_48;
  size_type local_40;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> local_38;
  Value *local_20;
  Value *cond_local;
  MatchInstr *pMStack_10;
  MatchClass op_local;
  MatchInstr *this_local;
  
  local_50 = 0;
  local_48 = &local_58;
  local_40 = 2;
  local_58 = cond;
  local_20 = cond;
  cond_local._4_4_ = op;
  pMStack_10 = this;
  std::allocator<flow::Value_*>::allocator(&local_59);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::vector(&local_38,__l,&local_59);
  TerminateInstr::TerminateInstr(&this->super_TerminateInstr,&local_38);
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::~vector(&local_38);
  std::allocator<flow::Value_*>::~allocator(&local_59);
  (this->super_TerminateInstr).super_Instr.super_Value._vptr_Value =
       (_func_int **)&PTR__MatchInstr_002d3338;
  this->op_ = cond_local._4_4_;
  std::
  vector<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
  ::vector(&this->cases_);
  return;
}

Assistant:

MatchInstr::MatchInstr(MatchClass op, Value* cond)
    : TerminateInstr({cond, nullptr}), op_(op) {}